

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void SetTexture(side_t *side,int position,char *name,FMissingTextureTracker *track)

{
  int iVar1;
  FTextureID FVar2;
  FMissingCount *pFVar3;
  long lVar4;
  int i;
  ulong uVar5;
  long lVar6;
  FString local_48;
  long local_40;
  char *local_38;
  
  FVar2 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  if (FVar2.texnum < 0) {
    local_38 = name;
    FString::FString(&local_48,name);
    pFVar3 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](track,&local_48);
    iVar1 = pFVar3->Count;
    pFVar3->Count = iVar1 + 1;
    FString::~FString(&local_48);
    FVar2 = TexMan.DefaultTexture;
    if (iVar1 < 0x14) {
      local_40 = (ulong)(uint)position << 2;
      lVar4 = 0x48;
      for (uVar5 = 0; FVar2.texnum = TexMan.DefaultTexture.texnum, (long)uVar5 < (long)numlines;
          uVar5 = uVar5 + 1) {
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
          if (*(side_t **)((long)lines->args + lVar6 * 2 + lVar4 + -0x2c) == side) {
            Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' on %s side of linedef %d\n",
                   _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE13positionnames_rel
                   + *(int *)(
                             _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE13positionnames_rel
                             + local_40),local_38,
                   (long)&
                         _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE9sidenames_rel
                   + (long)*(int *)((long)&
                                          _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE9sidenames_rel
                                   + lVar6),uVar5 & 0xffffffff);
          }
        }
        lVar4 = lVar4 + 0x98;
      }
    }
  }
  side->textures[position].texture.texnum = FVar2.texnum;
  return;
}

Assistant:

static void SetTexture (side_t *side, int position, const char *name, FMissingTextureTracker &track)
{
	static const char *positionnames[] = { "top", "middle", "bottom" };
	static const char *sidenames[] = { "first", "second" };

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			// Print an error that lists all references to this sidedef.
			// We must scan the linedefs manually for all references to this sidedef.
			for(int i = 0; i < numlines; i++)
			{
				for(int j = 0; j < 2; j++)
				{
					if (lines[i].sidedef[j] == side)
					{
						Printf(TEXTCOLOR_RED"Unknown %s texture '"
							TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
							"' on %s side of linedef %d\n",
							positionnames[position], name, sidenames[j], i);
					}
				}
			}
		}
		texture = TexMan.GetDefaultTexture();
	}
	side->SetTexture(position, texture);
}